

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void multi_thread_test(size_t ndocs,size_t wal_threshold,size_t time_sec,size_t nbatch,
                      size_t compact_term,size_t nwriters,size_t nreaders)

{
  fdb_doc *doc_00;
  pthread_t __th;
  timeval tVar1;
  timeval a;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  size_t *psVar6;
  size_t sVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar16;
  size_t asStack_1300 [2];
  undefined8 uStack_12f0;
  fdb_commit_opt_t fStack_12e9;
  undefined8 local_12e8;
  undefined4 uStack_12e0;
  undefined4 uStack_12dc;
  double local_12d8;
  long lStack_12d0;
  size_t *local_12c8 [2];
  size_t local_12b8;
  char *local_12b0;
  size_t local_12a8;
  char *local_12a0;
  __suseconds_t local_1298;
  __time_t local_1290;
  __suseconds_t local_1288;
  long local_1280;
  timeval local_1278;
  undefined1 local_1268 [8];
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char temp [1024];
  char bodybuf [1024];
  char metabuf [1024];
  char keybuf [1024];
  pthread_spinlock_t local_14c [2];
  pthread_spinlock_t filename_count_lock;
  int n_opened;
  int filename_count;
  fdb_kvs_info kvs_info;
  fdb_status status;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval ts_gap;
  timeval ts_cur;
  timeval ts_begin;
  work_thread_args *args;
  void **thread_ret;
  pthread_t *tid;
  int n;
  int r;
  int i;
  size_t nreads;
  size_t nwrites;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  size_t nwriters_local;
  size_t compact_term_local;
  size_t nbatch_local;
  size_t time_sec_local;
  size_t wal_threshold_local;
  size_t ndocs_local;
  undefined4 uVar15;
  
  uStack_12f0 = 0x10f244;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  __test_begin.tv_usec._0_4_ = (int)nwriters;
  iVar5 = (int)__test_begin.tv_usec + (int)nreaders;
  lVar2 = -0x12e8 - ((long)iVar5 * 8 + 0xfU & 0xfffffffffffffff0);
  lVar3 = lVar2 - ((long)iVar5 * 8 + 0xfU & 0xfffffffffffffff0);
  lVar4 = (long)iVar5 * -0x70 + lVar3;
  psVar6 = (size_t *)((long)&local_12e8 + (lVar4 - (ndocs * 8 + 0xf & 0xfffffffffffffff0)) + 0x12e8)
  ;
  filename_count_lock = 1;
  local_14c[1] = 0;
  psVar6[-1] = 0x10f300;
  pthread_spin_init(local_14c,1);
  psVar6[-1] = 0x10f30c;
  system("rm -rf  dummy* > errorlog.txt");
  psVar6[-1] = 0x10f31e;
  fdb_get_default_config();
  psVar6[-1] = 0x10f32a;
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0x100;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  psVar6[-1] = 0x10f356;
  memleak_start();
  psVar6[-1] = 0x10f364;
  printf("Initialize..\n");
  psVar6[-1] = 0x10f37f;
  sprintf((char *)&fconfig.num_blocks_readahead,"dummy%d",(ulong)(uint)filename_count_lock);
  psVar6[-1] = 0x10f399;
  fdb_open((fdb_file_handle **)psVar6[0x46],(char *)psVar6[0x45],(fdb_config *)psVar6[0x44]);
  psVar6[-1] = 0x10f3b3;
  fdb_kvs_open_default
            ((fdb_file_handle *)psVar6[1],(fdb_kvs_handle **)*psVar6,(fdb_kvs_config *)psVar6[-1]);
  psVar6[-1] = 0x10f3cd;
  kvs_info.file._4_4_ =
       fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"multi_thread_test");
  if (kvs_info.file._4_4_ != FDB_RESULT_SUCCESS) {
    psVar6[-1] = 0x10f400;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x756);
    multi_thread_test::__test_pass = 0;
    if (kvs_info.file._4_4_ != FDB_RESULT_SUCCESS) {
      psVar6[-1] = 0x10f434;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x756,
                    "void multi_thread_test(size_t, size_t, size_t, size_t, size_t, size_t, size_t)"
                   );
    }
  }
  psVar6[-1] = 0x10f446;
  gettimeofday((timeval *)&ts_cur.tv_usec,(__timezone_ptr_t)0x0);
  for (n = 0; (ulong)(long)n < ndocs; n = n + 1) {
    psVar6[-1] = 0x10f472;
    _set_random_string_smallabt((char *)psVar6[1],*(int *)((long)psVar6 + 4));
    psVar6[-1] = 0x10f494;
    sprintf(metabuf + 0x3f8,"k%07d%s",(ulong)(uint)n,&fconfig.num_blocks_readahead);
    psVar6[-1] = 0x10f4af;
    sprintf(bodybuf + 0x3f8,"m%07d",(ulong)(uint)n);
    psVar6[-1] = 0x10f4c0;
    _set_random_string_smallabt((char *)psVar6[1],*(int *)((long)psVar6 + 4));
    psVar6[-1] = 0x10f4e4;
    sprintf(temp + 0x3f8,"b%07d%07d%s",(ulong)(uint)n,0,&fconfig.num_blocks_readahead);
    local_12c8[0] = psVar6 + n;
    local_12c8[1] = (size_t *)(metabuf + 0x3f8);
    psVar6[-1] = 0x10f51a;
    local_12b8 = strlen(metabuf + 0x3f8);
    local_12b0 = bodybuf + 0x3f8;
    psVar6[-1] = 0x10f53b;
    local_12a8 = strlen(bodybuf + 0x3f8);
    local_12a0 = temp + 0x3f8;
    psVar6[-1] = 0x10f55c;
    sVar7 = strlen(temp + 0x3f8);
    psVar6[-2] = sVar7;
    psVar6[-3] = 0x10f593;
    fdb_doc_create((fdb_doc **)psVar6[2],(void *)psVar6[1],*psVar6,(void *)psVar6[-1],psVar6[-2],
                   (void *)psVar6[-3],psVar6[5]);
    doc_00 = (fdb_doc *)psVar6[n];
    psVar6[-1] = 0x10f5b5;
    fdb_set((fdb_kvs_handle *)doc,doc_00);
  }
  psVar6[-1] = 0x10f5da;
  fdb_commit((fdb_file_handle *)*psVar6,*(fdb_commit_opt_t *)((long)psVar6 + -1));
  psVar6[-1] = 0x10f5ea;
  gettimeofday((timeval *)&ts_gap.tv_usec,(__timezone_ptr_t)0x0);
  local_1288 = ts_cur.tv_usec;
  local_1298 = ts_gap.tv_usec;
  local_1290 = ts_cur.tv_sec;
  a.tv_usec = ts_begin.tv_sec;
  a.tv_sec = ts_cur.tv_usec;
  tVar1.tv_usec = ts_cur.tv_sec;
  tVar1.tv_sec = ts_gap.tv_usec;
  psVar6[-1] = 0x10f643;
  local_1278 = _utime_gap(a,tVar1);
  tVar1 = local_1278;
  ts_gap.tv_sec = local_1278.tv_usec;
  local_1278 = tVar1;
  psVar6[-1] = 0x10f679;
  fdb_kvs_close((fdb_kvs_handle *)*psVar6);
  psVar6[-1] = 0x10f685;
  fdb_close((fdb_file_handle *)*psVar6);
  for (n = 0; n < iVar5; n = n + 1) {
    *(int *)((long)&local_12e8 + (long)n * 0x70 + lVar4 + 0x12e8) = n;
    *(long *)((long)&uStack_12e0 + (long)n * 0x70 + lVar4 + 0x12e8) = (long)iVar5;
    *(long *)((long)&lStack_12d0 + (long)n * 0x70 + lVar4 + 0x12e8) =
         (long)(int)(uint)((ulong)(long)n < nwriters);
    *(size_t *)((long)&local_12d8 + (long)n * 0x70 + lVar4 + 0x12e8) = ndocs;
    *(size_t **)((long)local_12c8 + (long)n * 0x70 + lVar4 + 0x12e8) = psVar6;
    *(size_t *)((long)local_12c8 + (long)n * 0x70 + lVar4 + 0x12f0) = time_sec;
    *(size_t *)((long)&local_12b8 + (long)n * 0x70 + lVar4 + 0x12e8) = nbatch;
    *(size_t *)((long)&local_12b0 + (long)n * 0x70 + lVar4 + 0x12e8) = compact_term;
    *(pthread_spinlock_t **)((long)&local_12a8 + (long)n * 0x70 + lVar4 + 0x12e8) = local_14c + 1;
    *(pthread_spinlock_t **)((long)&local_12a0 + (long)n * 0x70 + lVar4 + 0x12e8) =
         &filename_count_lock;
    *(pthread_spinlock_t **)((long)&local_1298 + (long)n * 0x70 + lVar4 + 0x12e8) = local_14c;
    *(void ***)((long)&local_1288 + (long)n * 0x70 + lVar4 + 0x12e8) = &kvs_config.custom_cmp_param;
    *(undefined1 **)((long)&local_1280 + (long)n * 0x70 + lVar4 + 0x12e8) = local_1268;
    psVar6[-1] = 0x10f880;
    pthread_create((pthread_t *)((long)&local_12e8 + (long)n * 8 + lVar2 + 0x12e8),
                   (pthread_attr_t *)0x0,_worker_thread,
                   (void *)((long)&local_12e8 + (long)n * 0x70 + lVar4 + 0x12e8));
  }
  psVar6[-1] = 0x10f8a8;
  printf("wait for %d seconds..\n",time_sec & 0xffffffff);
  for (n = 0; n < iVar5; n = n + 1) {
    __th = *(pthread_t *)((long)&local_12e8 + (long)n * 8 + lVar2 + 0x12e8);
    psVar6[-1] = 0x10f8ec;
    pthread_join(__th,(void **)((long)&local_12e8 + (long)n * 8 + lVar3 + 0x12e8));
  }
  for (n = 0; (ulong)(long)n < ndocs; n = n + 1) {
    psVar6[-1] = 0x10f92b;
    fdb_doc_free((fdb_doc *)psVar6[-1]);
  }
  _r = 0;
  nreads = 0;
  for (n = 0; n < iVar5; n = n + 1) {
    if (*(long *)((long)&lStack_12d0 + (long)n * 0x70 + lVar4 + 0x12e8) == 0) {
      _r = *(long *)((long)&local_1290 + (long)n * 0x70 + lVar4 + 0x12e8) + _r;
    }
    else {
      nreads = *(long *)((long)&local_1290 + (long)n * 0x70 + lVar4 + 0x12e8) + nreads;
    }
  }
  local_12e8._0_4_ = 0x43300000;
  local_12e8._4_4_ = 0x45300000;
  uStack_12e0 = 0;
  uStack_12dc = 0;
  auVar9._8_4_ = (int)((ulong)_r >> 0x20);
  auVar9._0_8_ = _r;
  auVar9._12_4_ = 0x45300000;
  local_12d8 = 4503599627370496.0;
  lStack_12d0 = 0x4530000000000000;
  uVar15 = (undefined4)(time_sec >> 0x20);
  auVar13._8_4_ = uVar15;
  auVar13._0_8_ = time_sec;
  auVar13._12_4_ = 0x45300000;
  psVar6[-1] = 0x10fa52;
  printf("read: %.1f ops/sec\n",
         ((auVar9._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)_r) - 4503599627370496.0)) /
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)time_sec) - 4503599627370496.0)));
  auVar10._8_4_ = (int)(nreads >> 0x20);
  auVar10._0_8_ = nreads;
  auVar10._12_4_ = local_12e8._4_4_;
  dVar8 = (double)CONCAT44((undefined4)local_12e8,(int)nreads) - local_12d8;
  dVar11 = auVar10._8_8_ - (double)lStack_12d0;
  auVar14._8_4_ = uVar15;
  auVar14._0_8_ = time_sec;
  auVar14._12_4_ = local_12e8._4_4_;
  dVar12 = (double)CONCAT44((undefined4)local_12e8,(int)time_sec) - local_12d8;
  dVar16 = auVar14._8_8_ - (double)lStack_12d0;
  psVar6[-1] = 0x10faa5;
  printf("write: %.1f ops/sec\n",(dVar11 + dVar8) / (dVar16 + dVar12));
  psVar6[-1] = 0x10fac0;
  sprintf((char *)&fconfig.num_blocks_readahead,"dummy%d",(ulong)(uint)filename_count_lock);
  psVar6[-1] = 0x10fada;
  fdb_open((fdb_file_handle **)psVar6[0x46],(char *)psVar6[0x45],(fdb_config *)psVar6[0x44]);
  psVar6[-1] = 0x10faf4;
  fdb_kvs_open_default
            ((fdb_file_handle *)psVar6[1],(fdb_kvs_handle **)*psVar6,(fdb_kvs_config *)psVar6[-1]);
  psVar6[-1] = 0x10fb07;
  fdb_get_kvs_info((fdb_kvs_handle *)psVar6[0x2e],(fdb_kvs_info *)psVar6[0x2d]);
  if (kvs_info.name != (char *)(ndocs + nreads)) {
    psVar6[-1] = 0x10fb42;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x7a4);
    multi_thread_test::__test_pass = 0;
    if (kvs_info.name != (char *)(ndocs + nreads)) {
      psVar6[-1] = 0x10fb84;
      __assert_fail("kvs_info.last_seqnum == ndocs+nwrites",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x7a4,
                    "void multi_thread_test(size_t, size_t, size_t, size_t, size_t, size_t, size_t)"
                   );
    }
  }
  psVar6[-1] = 0x10fb92;
  fdb_kvs_close((fdb_kvs_handle *)*psVar6);
  psVar6[-1] = 0x10fb9e;
  fdb_close((fdb_file_handle *)*psVar6);
  psVar6[-1] = 0x10fba3;
  fdb_shutdown();
  psVar6[-1] = 0x10fba8;
  memleak_end();
  if (multi_thread_test::__test_pass == 0) {
    psVar6[-1] = 0x10fbf1;
    fprintf(_stderr,"%s FAILED\n","multi thread test");
  }
  else {
    psVar6[-1] = 0x10fbd0;
    fprintf(_stderr,"%s PASSED\n","multi thread test");
  }
  return;
}

Assistant:

void multi_thread_test(
    size_t ndocs, size_t wal_threshold, size_t time_sec,
    size_t nbatch, size_t compact_term, size_t nwriters, size_t nreaders)
{
    TEST_INIT();

    size_t nwrites, nreads;
    int i, r;
    int n = nwriters + nreaders;;
    thread_t *tid = alca(thread_t, n);
    void **thread_ret = alca(void *, n);
    struct work_thread_args *args = alca(struct work_thread_args, n);
    struct timeval ts_begin, ts_cur, ts_gap;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, ndocs);
    fdb_status status;
    fdb_kvs_info kvs_info;

    int filename_count = 1;
    int n_opened = 0;
    spin_t filename_count_lock;
    spin_init(&filename_count_lock);

    char keybuf[1024], metabuf[1024], bodybuf[1024], temp[1024];

    // remove previous dummy files
    r = system(SHELL_DEL" " FILENAME "* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    memleak_start();

    // initial population ===
    DBG("Initialize..\n");

    // open db
    sprintf(temp, FILENAME"%d", filename_count);
    fdb_open(&dbfile, temp, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "multi_thread_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    gettimeofday(&ts_begin, NULL);

    // insert documents
    for (i = 0; (size_t)i < ndocs; ++i){
        _set_random_string_smallabt(temp, KSIZE - (IDX_DIGIT+1));
        sprintf(keybuf, "k%0" IDX_DIGIT_STR "d%s", i, temp);

        sprintf(metabuf, "m%0" IDX_DIGIT_STR "d", i);

        _set_random_string_smallabt(temp, VSIZE-(IDX_DIGIT*2+1));
        sprintf(bodybuf, "b%0" IDX_DIGIT_STR "d%0" IDX_DIGIT_STR "d%s", i, 0, temp);

        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    gettimeofday(&ts_cur, NULL);
    ts_gap = _utime_gap(ts_begin, ts_cur);
    //DBG("%d.%09d seconds elapsed\n", (int)ts_gap.tv_sec, (int)ts_gap.tv_nsec);

    fdb_kvs_close(db);
    fdb_close(dbfile);
    // end of population ===

    // drop OS's page cache
    //r = system("free && sync && echo 3 > /proc/sys/vm/drop_caches && free");

    // create workers
    for (i=0;i<n;++i){
        args[i].tid = i;
        args[i].nthreads = n;
        args[i].writer = (((size_t)i<nwriters)?(1):(0));
        args[i].ndocs = ndocs;
        args[i].doc = doc;
        args[i].time_sec = time_sec;
        args[i].nbatch = nbatch;
        args[i].compact_term = compact_term;
        args[i].n_opened = &n_opened;
        args[i].filename_count = &filename_count;
        args[i].filename_count_lock = &filename_count_lock;
        args[i].config = &fconfig;
        args[i].kvs_config = &kvs_config;
        thread_create(&tid[i], _worker_thread, &args[i]);
    }

    printf("wait for %d seconds..\n", (int)time_sec);

    // wait for thread termination
    for (i=0;i<n;++i){
        thread_join(tid[i], &thread_ret[i]);
    }

    // free all documents
    for (i=0;(size_t)i<ndocs;++i){
        fdb_doc_free(doc[i]);
    }

    nwrites = nreads = 0;
    for (i=0;i<n;++i){
        if (args[i].writer) {
            nwrites += args[i].nops;
        } else {
            nreads += args[i].nops;
        }
    }
    printf("read: %.1f ops/sec\n", (double)nreads/time_sec);
    printf("write: %.1f ops/sec\n", (double)nwrites/time_sec);

    // check sequence number
    sprintf(temp, FILENAME"%d", filename_count);
    fdb_open(&dbfile, temp, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == ndocs+nwrites);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // shutdown
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("multi thread test");
}